

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionSystemData.cpp
# Opt level: O0

void __thiscall
DIS::ElectromagneticEmissionSystemData::unmarshal
          (ElectromagneticEmissionSystemData *this,DataStream *dataStream)

{
  undefined1 local_80 [8];
  ElectromagneticEmissionBeamData x;
  size_t idx;
  DataStream *dataStream_local;
  ElectromagneticEmissionSystemData *this_local;
  
  DataStream::operator>>(dataStream,&this->_systemDataLength);
  DataStream::operator>>(dataStream,&this->_numberOfBeams);
  DataStream::operator>>(dataStream,&this->_emissionsPadding2);
  EmitterSystem::unmarshal(&this->_emitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_location,dataStream);
  std::
  vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
  ::clear(&this->_beamDataRecords);
  for (x._trackJamTargets.
       super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      x._trackJamTargets.
      super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)(ulong)this->_numberOfBeams;
      x._trackJamTargets.
      super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(x._trackJamTargets.
                             super__Vector_base<DIS::TrackJamTarget,_std::allocator<DIS::TrackJamTarget>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            _vptr_TrackJamTarget + 1)) {
    ElectromagneticEmissionBeamData::ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_80);
    ElectromagneticEmissionBeamData::unmarshal
              ((ElectromagneticEmissionBeamData *)local_80,dataStream);
    std::
    vector<DIS::ElectromagneticEmissionBeamData,_std::allocator<DIS::ElectromagneticEmissionBeamData>_>
    ::push_back(&this->_beamDataRecords,(value_type *)local_80);
    ElectromagneticEmissionBeamData::~ElectromagneticEmissionBeamData
              ((ElectromagneticEmissionBeamData *)local_80);
  }
  return;
}

Assistant:

void ElectromagneticEmissionSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _systemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _emissionsPadding2;
    _emitterSystem.unmarshal(dataStream);
    _location.unmarshal(dataStream);

     _beamDataRecords.clear();
     for(size_t idx = 0; idx < _numberOfBeams; idx++)
     {
        ElectromagneticEmissionBeamData x;
        x.unmarshal(dataStream);
        _beamDataRecords.push_back(x);
     }
}